

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimerinfo_unix.cpp
# Opt level: O2

QList<QAbstractEventDispatcher::TimerInfoV2> * __thiscall
QTimerInfoList::registeredTimers
          (QList<QAbstractEventDispatcher::TimerInfoV2> *__return_storage_ptr__,QTimerInfoList *this
          ,QObject *object)

{
  QTimerInfo **ppQVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  TimerInfoV2 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (TimerInfoV2 *)0x0;
  (__return_storage_ptr__->d).size = 0;
  ppQVar1 = (this->timers).d.ptr;
  lVar2 = (this->timers).d.size;
  for (lVar4 = 0; lVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
    lVar3 = *(long *)((long)ppQVar1 + lVar4);
    if (*(QObject **)(lVar3 + 0x18) == object) {
      local_48.interval.__r = *(rep *)(lVar3 + 8);
      local_48._8_8_ = *(undefined8 *)(lVar3 + 0x10);
      QList<QAbstractEventDispatcher::TimerInfoV2>::
      emplaceBack<QAbstractEventDispatcher::TimerInfoV2>(__return_storage_ptr__,&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

auto QTimerInfoList::registeredTimers(QObject *object) const -> QList<TimerInfo>
{
    QList<TimerInfo> list;
    for (const auto &t : timers) {
        if (t->obj == object)
            list.emplaceBack(TimerInfo{t->interval, t->id, t->timerType});
    }
    return list;
}